

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  format_string_checker<char,_1,_0,_false> *pfVar2;
  byte bVar3;
  char *pcVar4;
  size_t sVar5;
  buffer<char> *buf;
  uint uVar6;
  ulong uVar7;
  char *begin;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_string_view<char> fmt_01;
  string_view fmt_02;
  basic_string_view<char> fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint local_78 [2];
  undefined8 local_70;
  undefined4 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 *local_48;
  code *local_40;
  
  uVar1 = tm_time->tm_hour;
  uVar6 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar6 = uVar1;
  }
  if (uVar6 < 100) {
    bVar3 = (byte)((uVar6 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar6 + bVar3 * -10 | 0x30;
  }
  else {
    local_78[0] = 1;
    local_70 = 0;
    local_68 = 0;
    local_60 = "{:02}";
    local_58 = 5;
    local_50 = 0x100000000;
    local_40 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt.size_ = (size_t)local_78;
    fmt.data_ = (char *)0x5;
    local_48 = (undefined1 *)local_78;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt,(format_string_checker<char,_1,_0,_false> *)dest);
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_78;
    args.desc_ = 1;
    local_78[0] = uVar6;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  pfVar2 = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar7;
  *(undefined1 *)((long)pfVar2->types_ + sVar5) = 0x3a;
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    local_78[0] = 1;
    local_70 = 0;
    local_68 = 0;
    local_60 = "{:02}";
    local_58 = 5;
    local_50 = 0x100000000;
    local_40 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_01.size_ = (size_t)local_78;
    fmt_01.data_ = (char *)0x5;
    local_48 = (undefined1 *)local_78;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_01,pfVar2);
    fmt_02.size_ = 5;
    fmt_02.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_78;
    args_00.desc_ = 1;
    local_78[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_02,args_00,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  pfVar2 = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar7;
  *(undefined1 *)((long)pfVar2->types_ + sVar5) = 0x3a;
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar7 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar7;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    local_78[0] = 1;
    local_70 = 0;
    local_68 = 0;
    local_60 = "{:02}";
    local_58 = 5;
    local_50 = 0x100000000;
    local_40 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_03.size_ = (size_t)local_78;
    fmt_03.data_ = (char *)0x5;
    local_48 = (undefined1 *)local_78;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_03,pfVar2);
    fmt_04.size_ = 5;
    fmt_04.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_78;
    args_01.desc_ = 1;
    local_78[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_04,args_01,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar7 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar7) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar7);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar7 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar7;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar4 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar4 = "PM";
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar4 + 2);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }